

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

int Vec_VecSizeSize(Vec_Vec_t *p)

{
  Vec_Ptr_t *pVVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < p->nSize; i = i + 1) {
    pVVar1 = Vec_VecEntry(p,i);
    iVar2 = iVar2 + pVVar1->nSize;
  }
  return iVar2;
}

Assistant:

static inline int Vec_VecSizeSize( Vec_Vec_t * p )
{
    Vec_Ptr_t * vVec;
    int i, Counter = 0;
    Vec_VecForEachLevel( p, vVec, i )
        Counter += vVec->nSize;
    return Counter;
}